

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.h
# Opt level: O0

void __thiscall
Iir::PoleFilter<Iir::Butterworth::BandPassBase,_Iir::DirectFormII,_3,_6>::PoleFilter
          (PoleFilter<Iir::Butterworth::BandPassBase,_Iir::DirectFormII,_3,_6> *this)

{
  CascadeStages<3,_Iir::DirectFormII> *in_RDI;
  Storage SVar1;
  LayoutBase *digitalStorage;
  LayoutBase *analogStorage;
  CascadeStages<3,_Iir::DirectFormII> *in_stack_ffffffffffffffb0;
  Storage local_18;
  
  Butterworth::BandPassBase::BandPassBase((BandPassBase *)0x1032d8);
  CascadeStages<3,_Iir::DirectFormII>::CascadeStages(in_stack_ffffffffffffffb0);
  digitalStorage = (LayoutBase *)&in_RDI[1].m_stages[1].m_b0;
  memset(digitalStorage,0,0x80);
  Layout<3>::Layout((Layout<3> *)in_RDI);
  analogStorage =
       (LayoutBase *)
       ((((PoleZeroPair *)in_RDI[2].m_stages)->poles).super_complex_pair_t.second._M_value + 8);
  memset(analogStorage,0,0xc0);
  Layout<6>::Layout((Layout<6> *)in_RDI);
  SVar1 = CascadeStages<3,_Iir::DirectFormII>::getCascadeStorage
                    ((CascadeStages<3,_Iir::DirectFormII> *)0x103342);
  local_18.stageArray = SVar1.stageArray;
  local_18.maxStages = SVar1.maxStages;
  Cascade::setCascadeStorage((Cascade *)in_RDI,&local_18);
  Layout::operator_cast_to_LayoutBase((Layout<3> *)digitalStorage);
  Layout::operator_cast_to_LayoutBase((Layout<6> *)digitalStorage);
  PoleFilterBase<Iir::Butterworth::AnalogLowPass>::setPrototypeStorage
            ((PoleFilterBase<Iir::Butterworth::AnalogLowPass> *)in_RDI,analogStorage,digitalStorage)
  ;
  CascadeStages<3,_Iir::DirectFormII>::reset(in_RDI);
  return;
}

Assistant:

PoleFilter ()
			{
				// This glues together the factored base classes
				// with the templatized storage classes.
				BaseClass::setCascadeStorage (this->getCascadeStorage());
				BaseClass::setPrototypeStorage (m_analogStorage, m_digitalStorage);
				CascadeStages<(MaxDigitalPoles + 1) / 2 , StateType>::reset();
			}